

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

float * __thiscall
sisl::sparse_array_n<float,_1,_std::allocator<float>_>::operator()
          (sparse_array_n<float,_1,_std::allocator<float>_> *this,uint d0,...)

{
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *this_00;
  char in_AL;
  uint uVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_f0;
  mapped_type local_ec;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &stack0x00000008;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  uVar1 = linear_index(this,d0,&local_e8);
  this_00 = &this->siteMap;
  local_f0 = uVar1;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_f0);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur ==
      (__node_type *)0x0) {
    local_ec = this->defaultValue;
    local_f0 = uVar1;
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_f0);
    *pmVar3 = local_ec;
  }
  local_f0 = uVar1;
  pmVar3 = std::__detail::
           _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_f0);
  return pmVar3;
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            auto iter = siteMap.find(index);
            if(iter == siteMap.end())
                siteMap[index] = defaultValue;

            return siteMap[index];
        }